

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_large_malloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  cache_bin_stats_t *pcVar1;
  long lVar2;
  uint uVar3;
  arena_t *paVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  
  if (arena < (arena_t *)0x7000000000000001) {
    paVar4 = (arena_t *)0x4000;
    if ((arena_t *)0x4000 < arena) {
      paVar4 = arena;
    }
    uVar6 = (long)paVar4 * 2 - 1;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = (uint)lVar2;
    iVar7 = uVar3 - 6;
    if (uVar3 < 6) {
      iVar7 = 0;
    }
    bVar5 = 4;
    if (6 < uVar3) {
      bVar5 = (char)lVar2 - 3;
    }
    uVar3 = ((uint)((((ulong)((long)&paVar4[-1].create_time.ns + 7U) >> (bVar5 & 0x3f)) <<
                    (bVar5 & 0x3f)) >> (bVar5 & 0x3f)) & 3) + iVar7 * 4 + 1;
  }
  else {
    uVar3 = 0xe8;
  }
  uVar6 = 0;
  if (0x23 < uVar3) {
    uVar6 = (ulong)(uVar3 - 0x24);
  }
  LOCK();
  pcVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_small
            [uVar6 * 2 + 10].tstats;
  pcVar1->nrequests = pcVar1->nrequests + 1;
  UNLOCK();
  return;
}

Assistant:

static void
arena_large_malloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	szind_t index, hindex;

	cassert(config_stats);

	if (usize < SC_LARGE_MINCLASS) {
		usize = SC_LARGE_MINCLASS;
	}
	index = sz_size2index(usize);
	hindex = (index >= SC_NBINS) ? index - SC_NBINS : 0;

	arena_stats_add_u64(tsdn, &arena->stats,
	    &arena->stats.lstats[hindex].nmalloc, 1);
}